

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O1

void la_dgeadd_os(int m,int n,double *a,int lda,double *b,int ldb,double *c,int ldc)

{
  ulong uVar1;
  ulong uVar2;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x27,
                  "void la_dgeadd_os(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (b == (double *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x28,
                  "void la_dgeadd_os(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (c == (double *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x29,
                  "void la_dgeadd_os(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  if ((0 < lda) && (n <= lda)) {
    if ((ldb < 1) || (ldb < n)) {
      __assert_fail("ldb >= 1 && ldb >= n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x2b,
                    "void la_dgeadd_os(int, int, const double *, int, const double *, int, double *, int)"
                   );
    }
    if ((0 < ldc) && (n <= ldc)) {
      if (0 < m) {
        uVar1 = 0;
        do {
          if (0 < n) {
            uVar2 = 0;
            do {
              c[uVar2] = a[uVar2] + b[uVar2];
              uVar2 = uVar2 + 1;
            } while ((uint)n != uVar2);
          }
          uVar1 = uVar1 + 1;
          c = c + (uint)ldc;
          b = b + (uint)ldb;
          a = a + (uint)lda;
        } while (uVar1 != (uint)m);
      }
      return;
    }
    __assert_fail("ldc >= 1 && ldc >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x2c,
                  "void la_dgeadd_os(int, int, const double *, int, const double *, int, double *, int)"
                 );
  }
  __assert_fail("lda >= 1 && lda >= n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x2a,
                "void la_dgeadd_os(int, int, const double *, int, const double *, int, double *, int)"
               );
}

Assistant:

void la_dgeadd_os(
        int m, int n,
        const double *a, int lda,
        const double *b, int ldb,
        double *c, int ldc)
{
    assert(a);
    assert(b);
    assert(c);
    assert(lda >= 1 && lda >= n);
    assert(ldb >= 1 && ldb >= n);
    assert(ldc >= 1 && ldc >= n);

    for (int i = 0; i < m; i++) {
        for (int j = 0; j < n; j++) {
            c[i * ldc + j] = a[i * lda + j] + b[i * ldb + j];
        }
    }
}